

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase34::TestCase34(TestCase34 *this)

{
  TestCase34 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
             ,0x22,"legacy test: Blob/Text");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005bf8b0;
  return;
}

Assistant:

TEST(Blob, Text) {
  std::string str = "foo";
  Text::Reader text = str.c_str();

  EXPECT_EQ("foo", text);
  EXPECT_STREQ("foo", text.cStr());
  EXPECT_STREQ("foo", text.begin());
  EXPECT_EQ(3u, text.size());

  Text::Reader text2 = "bar";
  EXPECT_EQ("bar", text2);

  char c[4] = "baz";
  Text::Reader text3(c);
  EXPECT_EQ("baz", text3);

  Text::Builder builder(c, 3);
  EXPECT_EQ("baz", builder);

  EXPECT_EQ(kj::arrayPtr("az", 2), builder.slice(1, 3));
}